

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O2

int findb(png_byte *name)

{
  char *pcVar1;
  long lVar2;
  anon_struct_32_7_46fe1f00 *paVar3;
  
  lVar2 = -0x19;
  paVar3 = chunk_info + 0x18;
  do {
    if (lVar2 == 0) {
      return -1;
    }
    pcVar1 = paVar3->name;
    lVar2 = lVar2 + 1;
    paVar3 = paVar3 + -1;
  } while (*(int *)pcVar1 != *(int *)name);
  return -(int)lVar2;
}

Assistant:

static int
findb(const png_byte *name)
{
   int i = NINFO;
   while (--i >= 0)
   {
      if (memcmp(chunk_info[i].name, name, 4) == 0)
         break;
   }

   return i;
}